

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::QuantileSortTree::WindowScalar<short,double,false>
          (QuantileSortTree *this,QuantileCursor<short> *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  long lVar1;
  pointer pWVar2;
  unsigned_long lidx;
  unsigned_long hidx;
  double dVar3;
  undefined1 auVar4 [16];
  Interpolator<false> interp;
  ID indirect;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  QuantileIndirect<short> local_38;
  
  unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
  operator->(&this->index_tree);
  duckdb::WindowMergeSortTree::Build();
  local_78.desc = false;
  lVar1 = n - 1;
  auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar4._0_8_ = lVar1;
  auVar4._12_4_ = 0x45300000;
  dStack_40 = auVar4._8_8_ - 1.9342813113834067e+25;
  local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                q->dbl;
  local_48 = local_78.RN;
  dVar3 = floor(local_78.RN);
  local_78.FRN = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
  dVar3 = ceil(local_48);
  local_78.CRN = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
  local_78.begin = 0;
  local_78.end = n;
  pWVar2 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
           operator->(&this->index_tree);
  lidx = duckdb::WindowIndexTree::SelectNth(pWVar2,(ulong)frames);
  hidx = lidx;
  if (local_78.CRN != local_78.FRN) {
    pWVar2 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree);
    hidx = duckdb::WindowIndexTree::SelectNth(pWVar2,(ulong)frames);
  }
  local_38.data = data;
  dVar3 = Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<short>>
                    (&local_78,lidx,hidx,result,&local_38);
  return dVar3;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}